

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O3

h__Writer * __thiscall
ASDCP::ATMOS::MXFWriter::h__Writer::DCData_DDesc_to_MD(h__Writer *this,DCDataDescriptor *DDesc)

{
  Rational RVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  undefined1 *puVar3;
  
  RVar1 = DDesc[0x12].EditRate;
  if (RVar1 == (Rational)0x0) {
    puVar3 = Kumu::RESULT_PTR;
  }
  else {
    *(undefined8 *)((long)RVar1 + 0xf0) = *in_RDX;
    *(ulong *)((long)RVar1 + 0xf8) = (ulong)*(uint *)(in_RDX + 1);
    *(undefined1 *)((long)RVar1 + 0x100) = 1;
    *(undefined1 *)((long)RVar1 + 0x158) = 1;
    uVar2 = *(undefined8 *)((long)in_RDX + 0x24);
    *(undefined8 *)((long)RVar1 + 0x159) = *(undefined8 *)((long)in_RDX + 0x1c);
    *(undefined8 *)((long)RVar1 + 0x161) = uVar2;
    puVar3 = Kumu::RESULT_OK;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::h__Writer::DCData_DDesc_to_MD(ASDCP::DCData::DCDataDescriptor& DDesc)
{
  ASDCP_TEST_NULL(m_EssenceDescriptor);
  MXF::PrivateDCDataDescriptor* DDescObj = static_cast<MXF::PrivateDCDataDescriptor *>(m_EssenceDescriptor);

  DDescObj->SampleRate = DDesc.EditRate;
  DDescObj->ContainerDuration = DDesc.ContainerDuration;
  DDescObj->DataEssenceCoding.Set(DDesc.DataEssenceCoding);  
  return RESULT_OK;
}